

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O0

void ImGui_ImplSDL2_Shutdown(void)

{
  int local_c;
  ImGuiMouseCursor cursor_n;
  
  g_Window = (SDL_Window *)0x0;
  if (g_ClipboardTextData != (char *)0x0) {
    SDL_free(g_ClipboardTextData);
  }
  g_ClipboardTextData = (char *)0x0;
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    SDL_FreeCursor(g_MouseCursors[local_c]);
  }
  memset(g_MouseCursors,0,0x40);
  return;
}

Assistant:

void ImGui_ImplSDL2_Shutdown()
{
    g_Window = NULL;

    // Destroy last known clipboard data
    if (g_ClipboardTextData)
        SDL_free(g_ClipboardTextData);
    g_ClipboardTextData = NULL;

    // Destroy SDL mouse cursors
    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
        SDL_FreeCursor(g_MouseCursors[cursor_n]);
    memset(g_MouseCursors, 0, sizeof(g_MouseCursors));
}